

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O2

TA_RetCode
TA_GetOptInputParameterInfo(TA_FuncHandle *handle,uint paramIndex,TA_OptInputParameterInfo **info)

{
  TA_OptInputParameterInfo *pTVar1;
  TA_RetCode TVar2;
  
  TVar2 = TA_BAD_PARAM;
  if (info != (TA_OptInputParameterInfo **)0x0 && handle != (TA_FuncHandle *)0x0) {
    *info = (TA_OptInputParameterInfo *)0x0;
    TVar2 = TA_INVALID_HANDLE;
    if (((*handle == 0xa201b201) && (*(long *)(handle + 2) != 0)) &&
       (TVar2 = TA_BAD_PARAM, paramIndex < *(uint *)(*(long *)(handle + 2) + 0x28))) {
      if (*(long *)(handle + 6) == 0) {
        return TA_INTERNAL_ERROR|TA_ALLOC_ERR;
      }
      pTVar1 = *(TA_OptInputParameterInfo **)(*(long *)(handle + 6) + (ulong)paramIndex * 8);
      *info = pTVar1;
      TVar2 = TA_INTERNAL_ERROR|TA_GROUP_NOT_FOUND;
      if (pTVar1 != (TA_OptInputParameterInfo *)0x0) {
        TVar2 = TA_SUCCESS;
      }
      return TVar2;
    }
  }
  return TVar2;
}

Assistant:

TA_RetCode TA_GetOptInputParameterInfo( const TA_FuncHandle *handle,
                                        unsigned int paramIndex,
                                        const TA_OptInputParameterInfo **info )
{
   const TA_FuncDef  *funcDef;
   const TA_FuncInfo *funcInfo;
   const TA_OptInputParameterInfo **inputTable;

   if( (handle == NULL) || (info == NULL) )
   {
      return TA_BAD_PARAM;
   }

   *info = NULL;

   /* Validate that this is a valid funcHandle. */
   funcDef = (const TA_FuncDef *)handle;
   if( funcDef->magicNumber != TA_FUNC_DEF_MAGIC_NB )
   {
      return TA_INVALID_HANDLE;
   }

   funcInfo = funcDef->funcInfo;

   if( !funcInfo )
      return TA_INVALID_HANDLE;

   if( paramIndex >= funcInfo->nbOptInput )
   {
      return TA_BAD_PARAM;
   }

   inputTable = (const TA_OptInputParameterInfo **)funcDef->optInput;

   if( !inputTable )
      return TA_INTERNAL_ERROR(3);

   *info = inputTable[paramIndex];

   if( !(*info) )
      return TA_INTERNAL_ERROR(4);

   return TA_SUCCESS;
}